

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * to_string_abi_cxx11_(string *__return_storage_ptr__,LogLevel ll)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (ll == Error) {
    pcVar2 = "[Error] ";
    pcVar1 = "";
  }
  else if (ll == Warning) {
    pcVar2 = "[Warning] ";
    pcVar1 = "";
  }
  else {
    pcVar2 = "[Log] ";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const LogLevel ll) {
	switch (ll) {
		case LogLevel::Warning:
			return "[Warning] ";
		case LogLevel::Error:
			return "[Error] ";
	}
	return "[Log] ";
}